

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

SubControl __thiscall
QStyleSheetStyle::hitTestComplexControl
          (QStyleSheetStyle *this,ComplexControl cc,QStyleOptionComplex *opt,QPoint *pt,QWidget *w)

{
  QPoint *pQVar1;
  QStyleSheetStyle *pQVar2;
  bool bVar3;
  char cVar4;
  SubControl SVar5;
  QStyle *pQVar6;
  long in_FS_OFFSET;
  QHash<QStyle::SubControl,_QRect> layout;
  QRenderRule rule;
  SubControl local_fc;
  QPoint local_f8;
  QPoint QStack_f0;
  QHash<QStyle::SubControl,_QRect> local_e0;
  QRenderRule local_d8;
  TryEmplaceResult local_50;
  long local_38;
  
  pQVar2 = globalStyleSheetStyle;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar6 = baseStyle(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      SVar5 = (**(code **)(*(long *)pQVar6 + 0xd0))
                        (pQVar6,cc,opt,pt,w,*(code **)(*(long *)pQVar6 + 0xd0));
      return SVar5;
    }
    goto LAB_003639de;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  switch(cc) {
  case CC_ScrollBar:
    memset(&local_d8,0xaa,0x88);
    renderRule(&local_d8,this,&w->super_QObject,&opt->super_QStyleOption,0);
    bVar3 = QRenderRule::hasDrawable(&local_d8);
    QRenderRule::~QRenderRule(&local_d8);
    if ((!bVar3) && (local_d8.b.d.ptr == (QStyleSheetBoxData *)0x0)) goto switchD_00363743_caseD_6;
  case CC_SpinBox:
  case CC_ComboBox:
  case CC_Slider:
  case CC_ToolButton:
  case CC_GroupBox:
LAB_0036374b:
    SVar5 = QCommonStyle::hitTestComplexControl((QCommonStyle *)this,cc,opt,pt,w);
    break;
  case CC_TitleBar:
    if (((opt == (QStyleOptionComplex *)0x0) || ((opt->super_QStyleOption).version < 1)) ||
       ((opt->super_QStyleOption).type != 0xf0005)) goto switchD_00363743_caseD_6;
    memset(&local_d8,0xaa,0x88);
    renderRule(&local_d8,this,&w->super_QObject,&opt->super_QStyleOption,0x41);
    bVar3 = QRenderRule::hasDrawable(&local_d8);
    if (((!bVar3) && (local_d8.b.d.ptr == (QStyleSheetBoxData *)0x0)) &&
       (local_d8.bd.d.ptr == (QStyleSheetBorderData *)0x0)) {
      QRenderRule::~QRenderRule(&local_d8);
      goto switchD_00363743_caseD_6;
    }
    local_e0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    titleBarLayout((QStyleSheetStyle *)&local_e0,(QWidget *)this,(QStyleOptionTitleBar *)w);
    local_f8.xp.m_i = 0;
    local_f8.yp.m_i = 0;
    QStack_f0.xp.m_i = -1;
    QStack_f0.yp.m_i = -1;
    SVar5 = SC_ComboBoxFrame;
    do {
      local_fc = SVar5;
      QHash<QStyle::SubControl,QRect>::tryEmplace_impl<QStyle::SubControl_const&>
                (&local_50,&local_e0,&local_fc);
      pQVar1 = (QPoint *)
               ((local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries
                [(local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                 [(uint)local_50.iterator.i.bucket & 0x7f]].storage.data + 4);
      local_f8 = *pQVar1;
      QStack_f0 = pQVar1[1];
      if (local_f8.xp.m_i <= QStack_f0.xp.m_i) {
        if ((local_f8.yp.m_i <= QStack_f0.yp.m_i) &&
           (cVar4 = QRect::contains(&local_f8,SUB81(pt,0)), cVar4 != '\0')) goto LAB_003639c5;
      }
      bVar3 = SVar5 < (SC_ScrollBarGroove|SC_ComboBoxFrame);
      SVar5 = SVar5 * 2;
    } while (bVar3);
    SVar5 = SC_None;
LAB_003639c5:
    QHash<QStyle::SubControl,_QRect>::~QHash(&local_e0);
    QRenderRule::~QRenderRule(&local_d8);
    break;
  default:
switchD_00363743_caseD_6:
    pQVar6 = baseStyle(this);
    SVar5 = (**(code **)(*(long *)pQVar6 + 0xd0))(pQVar6,cc,opt,pt,w);
    break;
  case CC_MdiControls:
    bVar3 = hasStyleRule(this,&w->super_QObject,0x3e);
    if (((!bVar3) && (bVar3 = hasStyleRule(this,&w->super_QObject,0x40), !bVar3)) &&
       (bVar3 = hasStyleRule(this,&w->super_QObject,0x3f), !bVar3)) goto switchD_00363743_caseD_6;
    cc = CC_MdiControls;
    goto LAB_0036374b;
  }
  if (pQVar2 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SVar5;
  }
LAB_003639de:
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QStyleSheetStyle::hitTestComplexControl(ComplexControl cc, const QStyleOptionComplex *opt,
                                 const QPoint &pt, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->hitTestComplexControl(cc, opt, pt, w))
    switch (cc) {
    case CC_TitleBar:
        if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            QRenderRule rule = renderRule(w, opt, PseudoElement_TitleBar);
            if (rule.hasDrawable() || rule.hasBox() || rule.hasBorder()) {
                QHash<QStyle::SubControl, QRect> layout = titleBarLayout(w, tb);
                QRect r;
                QStyle::SubControl sc = QStyle::SC_None;
                uint ctrl = SC_TitleBarSysMenu;
                while (ctrl <= SC_TitleBarLabel) {
                    r = layout[QStyle::SubControl(ctrl)];
                    if (r.isValid() && r.contains(pt)) {
                        sc = QStyle::SubControl(ctrl);
                        break;
                    }
                    ctrl <<= 1;
                }
                return sc;
            }
        }
        break;

    case CC_MdiControls:
        if (hasStyleRule(w, PseudoElement_MdiCloseButton)
            || hasStyleRule(w, PseudoElement_MdiNormalButton)
            || hasStyleRule(w, PseudoElement_MdiMinButton))
            return QWindowsStyle::hitTestComplexControl(cc, opt, pt, w);
        break;

    case CC_ScrollBar: {
        QRenderRule rule = renderRule(w, opt);
        if (!rule.hasDrawable() && !rule.hasBox())
            break;
                       }
        Q_FALLTHROUGH();
    case CC_SpinBox:
    case CC_GroupBox:
    case CC_ComboBox:
    case CC_Slider:
    case CC_ToolButton:
        return QWindowsStyle::hitTestComplexControl(cc, opt, pt, w);
    default:
        break;
    }

    return baseStyle()->hitTestComplexControl(cc, opt, pt, w);
}